

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

void __thiscall
WorldShuffler::randomize_oracle_stone_hint(WorldShuffler *this,Item *forbidden_fortune_teller_item)

{
  RandomizerWorld *pRVar1;
  pointer ppIVar2;
  bool bVar3;
  uint16_t uVar4;
  HintSource *this_00;
  Item *pIVar5;
  reference ppIVar6;
  WorldNode *pWVar7;
  WorldNode *start_node;
  ostream *poVar8;
  LandstalkerException *this_01;
  vector<Item_*,_std::allocator<Item_*>_> *__range4;
  pointer ppIVar9;
  initializer_list<Item_*> __l;
  vector<Item_*,_std::allocator<Item_*>_> min_items_to_reach;
  vector<Item_*,_std::allocator<Item_*>_> hintable_items;
  vector<Item_*,_std::allocator<Item_*>_> forbidden_items;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources;
  WorldSolver solver;
  
  pRVar1 = this->_world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&solver,"Oracle Stone",(allocator<char> *)&min_items_to_reach);
  this_00 = RandomizerWorld::hint_source(pRVar1,(string *)&solver);
  std::__cxx11::string::~string((string *)&solver);
  HintSource::text_abi_cxx11_((string *)&solver,this_00);
  pWVar7 = solver._start_node;
  std::__cxx11::string::~string((string *)&solver);
  if (pWVar7 == (WorldNode *)0x0) {
    uVar4 = RandomizerWorld::item_quantity(this->_world,'0');
    if (uVar4 != 0) {
      RandomizerWorld::add_used_hint_source(this->_world,this_00);
      solver._world = (RandomizerWorld *)forbidden_fortune_teller_item;
      solver._start_node = (WorldNode *)World::item(&this->_world->super_World,'(');
      solver._end_node = (WorldNode *)World::item(&this->_world->super_World,'*');
      solver._forbidden_items._M_t._M_impl._0_8_ = World::item(&this->_world->super_World,'4');
      solver._forbidden_items._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           World::item(&this->_world->super_World,'!');
      solver._forbidden_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)World::item(&this->_world->super_World,'\"');
      __l._M_len = 6;
      __l._M_array = (iterator)&solver;
      std::vector<Item_*,_std::allocator<Item_*>_>::vector
                (&forbidden_items,__l,(allocator_type *)&min_items_to_reach);
      pRVar1 = this->_world;
      pIVar5 = World::item(&pRVar1->super_World,'0');
      RandomizerWorld::item_sources_with_item(&sources,pRVar1,pIVar5);
      pRVar1 = this->_world;
      ppIVar6 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::at(&sources,0);
      pWVar7 = RandomizerWorld::node(pRVar1,&(*ppIVar6)->_node_id);
      if (pWVar7 != (WorldNode *)0x0) {
        WorldSolver::WorldSolver(&solver,this->_world);
        start_node = RandomizerWorld::spawn_node(this->_world);
        World::starting_inventory(&min_items_to_reach,&this->_world->super_World);
        bVar3 = WorldSolver::try_to_solve(&solver,start_node,pWVar7,&min_items_to_reach);
        std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
                  (&min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&min_items_to_reach,"./debug.json",(allocator<char> *)&hintable_items
                    );
          dump_json_to_file(&(this->_solver)._debug_log,(string *)&min_items_to_reach);
          std::__cxx11::string::~string((string *)&min_items_to_reach);
          this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&min_items_to_reach,
                     "Could not find minimal inventory to reach Oracle Stone",
                     (allocator<char> *)&hintable_items);
          LandstalkerException::LandstalkerException(this_01,(string *)&min_items_to_reach);
          __cxa_throw(this_01,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        WorldSolver::find_minimal_inventory(&min_items_to_reach,&solver);
        for (ppIVar9 = (pointer)CONCAT71(min_items_to_reach.
                                         super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                                         .super__Vector_impl_data._M_start._1_7_,
                                         (uint8_t)min_items_to_reach.
                                                  super__Vector_base<Item_*,_std::allocator<Item_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
            ppIVar9 !=
            min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppIVar9 = ppIVar9 + 1) {
          hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*ppIVar9;
          bVar3 = vectools::contains<Item*>(&forbidden_items,(Item **)&hintable_items);
          if (!bVar3) {
            std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                      ((vector<Item*,std::allocator<Item*>> *)&forbidden_items,
                       (Item **)&hintable_items);
          }
        }
        std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
                  (&min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
        WorldSolver::~WorldSolver(&solver);
      }
      hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppIVar2 = (this->_minimal_items_to_complete).
                super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      for (ppIVar9 = (this->_minimal_items_to_complete).
                     super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppIVar9 != ppIVar2; ppIVar9 = ppIVar9 + 1) {
        solver._world = (RandomizerWorld *)*ppIVar9;
        bVar3 = vectools::contains<Item*>(&forbidden_items,(Item **)&solver);
        if (!bVar3) {
          std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                    ((vector<Item*,std::allocator<Item*>> *)&hintable_items,(Item **)&solver);
        }
      }
      if (hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        vectools::shuffle<Item*>(&hintable_items,&this->_rng);
        pIVar5 = *hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::__cxx11::stringstream::stringstream((stringstream *)&solver);
        poVar8 = std::operator<<((ostream *)&solver._end_node,"You will need ");
        poVar8 = std::operator<<(poVar8,(string *)&pIVar5->_name);
        poVar8 = std::operator<<(poVar8,". It is ");
        random_hint_for_item_abi_cxx11_((string *)&min_items_to_reach,this,pIVar5);
        poVar8 = std::operator<<(poVar8,(string *)&min_items_to_reach);
        std::operator<<(poVar8,".");
        std::__cxx11::string::~string((string *)&min_items_to_reach);
        std::__cxx11::stringbuf::str();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&this_00->_text,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &min_items_to_reach);
        std::__cxx11::string::~string((string *)&min_items_to_reach);
        min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = pIVar5->_id;
        vectools::erase_first<unsigned_char>
                  (&this->_hintable_item_requirements,(uchar *)&min_items_to_reach);
        min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = pIVar5->_id;
        vectools::erase_first<unsigned_char>
                  (&this->_hintable_item_locations,(uchar *)&min_items_to_reach);
        std::__cxx11::stringstream::~stringstream((stringstream *)&solver);
        std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
                  (&hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
        std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base
                  (&sources.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>);
        std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
                  (&forbidden_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
        return;
      }
      std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
                (&hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
      std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base
                (&sources.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>);
      std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
                (&forbidden_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&solver,"The stone looks blurry. It looks like it won\'t be of any use...",
               (allocator<char> *)&min_items_to_reach);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this_00->_text,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&solver);
    std::__cxx11::string::~string((string *)&solver);
  }
  else {
    RandomizerWorld::add_used_hint_source(this->_world,this_00);
  }
  return;
}

Assistant:

void WorldShuffler::randomize_oracle_stone_hint(Item* forbidden_fortune_teller_item)
{
    HintSource* oracle_stone_source = _world.hint_source("Oracle Stone");

    // If hint source already contains text (e.g. through plando descriptor), ignore it
    if(!oracle_stone_source->text().empty())
    {
        _world.add_used_hint_source(oracle_stone_source);
        return;
    }

    if(_world.item_quantity(ITEM_ORACLE_STONE) > 0)
    {
        _world.add_used_hint_source(oracle_stone_source);

        std::vector<Item*> forbidden_items = {
                forbidden_fortune_teller_item, _world.item(ITEM_RED_JEWEL), _world.item(ITEM_PURPLE_JEWEL),
                _world.item(ITEM_GREEN_JEWEL), _world.item(ITEM_BLUE_JEWEL), _world.item(ITEM_YELLOW_JEWEL)
        };

        // Also excluding items strictly needed to get to Oracle Stone's location
        std::vector<ItemSource*> sources = _world.item_sources_with_item(_world.item(ITEM_ORACLE_STONE));
        WorldNode* first_source_node = _world.node(sources.at(0)->node_id());
        if(first_source_node)
        {
            WorldSolver solver(_world);
            if(solver.try_to_solve(_world.spawn_node(), first_source_node, _world.starting_inventory()))
            {
                std::vector<Item*> min_items_to_reach = solver.find_minimal_inventory();
                for(Item* item : min_items_to_reach)
                    if(!vectools::contains(forbidden_items, item))
                        forbidden_items.emplace_back(item);
            }
            else
            {
                dump_json_to_file(_solver.debug_log(), "./debug.json");
                throw LandstalkerException("Could not find minimal inventory to reach Oracle Stone");
            }
        }

        std::vector<Item*> hintable_items;
        for(Item* item : _minimal_items_to_complete)
        {
            if(!vectools::contains(forbidden_items, item))
                hintable_items.emplace_back(item);
        }

        if(!hintable_items.empty())
        {
            vectools::shuffle(hintable_items, _rng);
            Item* hinted_item = *hintable_items.begin();

            std::stringstream oracle_stone_hint;
            oracle_stone_hint << "You will need " << hinted_item->name() << ". It is "
                              << this->random_hint_for_item(hinted_item) << ".";
            oracle_stone_source->text(oracle_stone_hint.str());

            vectools::erase_first(_hintable_item_requirements, hinted_item->id());
            vectools::erase_first(_hintable_item_locations, hinted_item->id());
            return;
        }
    }

    oracle_stone_source->text("The stone looks blurry. It looks like it won't be of any use...");
}